

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6aa98::DepsLogTestInvalidHeader::Run(DepsLogTestInvalidHeader *this)

{
  char *__s;
  Test *pTVar1;
  bool bVar2;
  bool condition;
  int iVar3;
  LoadStatus LVar4;
  FILE *__s_00;
  size_t __n;
  size_t sVar5;
  long lVar6;
  allocator<char> local_1e1;
  long local_1e0;
  string err;
  DepsLog log;
  string local_158;
  State state;
  
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 0x28) {
      return;
    }
    __s_00 = fopen("DepsLogTest-tempfile","wb");
    bVar2 = testing::Test::Check
                      (g_current_test,__s_00 != (FILE *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x153,"deps_log != __null");
    pTVar1 = g_current_test;
    if (!bVar2) break;
    __s = *(char **)((long)&DAT_001e1ea0 + lVar6);
    local_1e0 = lVar6;
    __n = strlen(__s);
    sVar5 = fwrite(__s,1,__n,__s_00);
    bVar2 = testing::Test::Check
                      (pTVar1,__n == sVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x156,
                       "strlen(kInvalidHeaders[i]) == fwrite(kInvalidHeaders[i], 1, strlen(kInvalidHeaders[i]), deps_log)"
                      );
    pTVar1 = g_current_test;
    if (!bVar2) break;
    iVar3 = fclose(__s_00);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x157,"0 == fclose(deps_log)");
    if (!bVar2) break;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    log.needs_recompaction_ = false;
    log.file_ = (FILE *)0x0;
    log.file_path_._M_dataplus._M_p = (pointer)&log.file_path_.field_2;
    log.file_path_._M_string_length = 0;
    log.file_path_.field_2._M_local_buf[0] = '\0';
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    State::State(&state);
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DepsLogTest-tempfile",&local_1e1);
    LVar4 = DepsLog::Load(&log,&local_158,&state,&err);
    bVar2 = testing::Test::Check
                      (pTVar1,LVar4 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x15c,"log.Load(kTestFilename, &state, &err)");
    std::__cxx11::string::~string((string *)&local_158);
    pTVar1 = g_current_test;
    if (bVar2) {
      condition = std::operator==("bad deps log signature or version; starting over",&err);
      testing::Test::Check
                (pTVar1,condition,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                 ,0x15d,"\"bad deps log signature or version; starting over\" == err");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    State::~State(&state);
    DepsLog::~DepsLog(&log);
    std::__cxx11::string::~string((string *)&err);
    lVar6 = local_1e0 + 8;
    if (!bVar2) {
      return;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(DepsLogTest, InvalidHeader) {
  const char *kInvalidHeaders[] = {
    "",                              // Empty file.
    "# ninjad",                      // Truncated first line.
    "# ninjadeps\n",                 // No version int.
    "# ninjadeps\n\001\002",         // Truncated version int.
    "# ninjadeps\n\001\002\003\004"  // Invalid version int.
  };
  for (size_t i = 0; i < sizeof(kInvalidHeaders) / sizeof(kInvalidHeaders[0]);
       ++i) {
    FILE* deps_log = fopen(kTestFilename, "wb");
    ASSERT_TRUE(deps_log != NULL);
    ASSERT_EQ(
        strlen(kInvalidHeaders[i]),
        fwrite(kInvalidHeaders[i], 1, strlen(kInvalidHeaders[i]), deps_log));
    ASSERT_EQ(0 ,fclose(deps_log));

    string err;
    DepsLog log;
    State state;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));
    EXPECT_EQ("bad deps log signature or version; starting over", err);
  }
}